

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscanf.c
# Opt level: O2

int swscanf_s(char16_t_conflict *string,char16_t_conflict *format,...)

{
  char in_AL;
  wchar_t wVar1;
  size_t sVar2;
  int *piVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *pcVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  tSafeCRT_AssertFuncPtr p_Var5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  unsigned_long uStack_120;
  va_list arglist;
  miniFILE local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  arglist[0].reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  arglist[0].overflow_arg_area = &stack0x00000008;
  arglist[0].gp_offset = 0x10;
  arglist[0].fp_offset = 0x30;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  sVar2 = wcsnlen((wchar_t *)string,0x7fffffff);
  if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0 || string != (char16_t_conflict *)0x0) {
    if (string != (char16_t_conflict *)0x0) {
      if (format == (char16_t_conflict *)0x0 && sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0
         ) {
        (*sMBUSafeCRTAssertFunc)
                  ("\"(format != NULL)\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
                   ,0x7a);
      }
      else if (format != (char16_t_conflict *)0x0) {
        local_f8._flag = 0xd;
        local_f8._cnt = 0x7fffffff;
        if (sVar2 < 0x40000000) {
          local_f8._cnt = (int)sVar2 * 2;
        }
        local_f8._ptr = (char *)string;
        local_f8._base = (char *)string;
        wVar1 = __twinput_s(&local_f8,format,arglist);
        return wVar1;
      }
      p_Var5 = sMBUSafeCRTAssertFunc;
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      if (p_Var5 == (tSafeCRT_AssertFuncPtr)0x0) {
        return -1;
      }
      pcVar4 = "\"(format != NULL)\"";
      uStack_120 = 0x7a;
      goto LAB_0011f16c;
    }
  }
  else {
    (*sMBUSafeCRTAssertFunc)
              ("\"(string != NULL)\"","SafeCRT assert failed",
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
               ,0x79);
  }
  p_Var5 = sMBUSafeCRTAssertFunc;
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  if (p_Var5 == (tSafeCRT_AssertFuncPtr)0x0) {
    return -1;
  }
  pcVar4 = "\"(string != NULL)\"";
  uStack_120 = 0x79;
LAB_0011f16c:
  (*p_Var5)(pcVar4,"SafeCRT assert failed",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
            ,uStack_120);
  return -1;
}

Assistant:

int __cdecl swscanf_s (
        const char16_t *string,
        const char16_t *format,
        ...
        )
{
        int ret;
        va_list arglist;
        va_start(arglist, format);
        ret = vwscan_fn(__twinput_s, string, format, arglist);
        va_end(arglist);
        return ret;
}